

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O3

void __thiscall leveldb::FileMetaData::~FileMetaData(FileMetaData *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->largest).rep_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->largest).rep_.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->smallest).rep_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->smallest).rep_.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

FileMetaData() : refs(0), allowed_seeks(1 << 30), file_size(0) {}